

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

Var Js::JavascriptBigInt::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var aValue;
  Var aValue_00;
  JavascriptBigInt *aValue_01;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  int in_stack_00000010;
  Arguments local_58;
  undefined1 auStack_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x3a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc85ba;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_48,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((auStack_48._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x3d,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bc85ba;
    *puVar5 = 0;
  }
  aValue = Arguments::GetNewTarget((Arguments *)auStack_48);
  local_58.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_58);
  if ((auStack_48._0_4_ & 0xfffffe) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x4f,"(false)","false");
    if (!bVar4) goto LAB_00bc85ba;
    *puVar5 = 0;
    aValue_01 = (JavascriptBigInt *)0x0;
  }
  else {
    aValue_00 = Arguments::operator[]((Arguments *)auStack_48,1);
    aValue_01 = JavascriptConversion::ToBigInt(aValue_00,pSVar1);
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x56,"(false)","false");
    if (!bVar4) {
LAB_00bc85ba:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (bVar3) {
    constructor = VarTo<Js::RecyclableObject>(aValue);
    obj = UnsafeVarTo<Js::RecyclableObject>(aValue_01);
    aValue_01 = (JavascriptBigInt *)
                JavascriptOperators::OrdinaryCreateFromConstructor
                          (constructor,obj,(DynamicObject *)0x0,pSVar1);
  }
  return aValue_01;
}

Assistant:

Var JavascriptBigInt::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.HasArg(), "Should always have implicit 'this'");

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        Var result = nullptr;

        if (args.Info.Count > 1)
        {
            result = JavascriptConversion::ToBigInt(args[1], scriptContext);
        }
        else
        {
            // TODO:
            // v8 throw: cannot convert from undefined to bigint
            // we can consider creating a Zero BigInt
            AssertOrFailFast(false);
        }

        if (callInfo.Flags & CallFlags_New)
        {
            // TODO: handle new constructor
            // v8 throw: bigint is not a constructor
            AssertOrFailFast(false);
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), UnsafeVarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }